

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase153::run(TestCase153 *this)

{
  bool bVar1;
  Arena arena;
  Runnable local_180;
  Arena *local_178;
  NullableValue<kj::Exception> local_170;
  
  (anonymous_namespace)::TestObject::count = 0;
  (anonymous_namespace)::TestObject::throwAt = 1;
  Arena::Arena(&arena,0x400);
  Arena::allocate<kj::(anonymous_namespace)::TestObject>(&arena);
  local_180._vptr_Runnable = (_func_int **)&PTR_run_00421088;
  local_178 = &arena;
  _::runCatchingExceptions((Maybe<kj::Exception> *)&local_170,&local_180);
  bVar1 = local_170.isSet;
  _::NullableValue<kj::Exception>::~NullableValue(&local_170);
  if (_::Debug::minSeverity < 3 && bVar1 == false) {
    _::Debug::log<char_const(&)[97]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/arena-test.c++"
               ,0xa1,ERROR,
               "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { arena.allocate<TestObject>(); }) != nullptr\""
               ,(char (*) [97])
                "failed: expected ::kj::runCatchingExceptions([&]() { arena.allocate<TestObject>(); }) != nullptr"
              );
  }
  if (((anonymous_namespace)::TestObject::count != 1) && (_::Debug::minSeverity < 3)) {
    local_170.isSet = true;
    local_170._1_3_ = 0;
    _::Debug::log<char_const(&)[44],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/arena-test.c++"
               ,0xa2,ERROR,
               "\"failed: expected \" \"(1) == (TestObject::count)\", 1, TestObject::count",
               (char (*) [44])"failed: expected (1) == (TestObject::count)",(int *)&local_170,
               &(anonymous_namespace)::TestObject::count);
  }
  Arena::~Arena(&arena);
  if (((anonymous_namespace)::TestObject::count != 0) && (_::Debug::minSeverity < 3)) {
    local_170.isSet = false;
    local_170._1_3_ = 0;
    _::Debug::log<char_const(&)[44],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/arena-test.c++"
               ,0xa5,ERROR,
               "\"failed: expected \" \"(0) == (TestObject::count)\", 0, TestObject::count",
               (char (*) [44])"failed: expected (0) == (TestObject::count)",(int *)&local_170,
               &(anonymous_namespace)::TestObject::count);
  }
  return;
}

Assistant:

TEST(AsyncUnixTest, SignalsMultiListen) {
  captureSignals();
  UnixEventPort port;
  EventLoop loop(port);
  WaitScope waitScope(loop);

  port.onSignal(SIGIO).then([](siginfo_t&&) {
    KJ_FAIL_EXPECT("Received wrong signal.");
  }).detach([](kj::Exception&& exception) {
    KJ_FAIL_EXPECT(exception);
  });

  kill(getpid(), SIGURG);

  siginfo_t info = port.onSignal(SIGURG).wait(waitScope);
  EXPECT_EQ(SIGURG, info.si_signo);
  EXPECT_SI_CODE(SI_USER, info.si_code);
}